

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O2

uint32_t __thiscall duckdb::EncryptionTransport::Finalize(EncryptionTransport *this)

{
  EncryptionTransport *pEVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  EncryptionState *pEVar5;
  long lVar6;
  ulong uVar7;
  idx_t pos;
  ulong uVar8;
  uint32_t total_length;
  shared_ptr<duckdb::EncryptionState,_true> *local_1058;
  EncryptionTransport *local_1050;
  data_t tag [16];
  data_t aes_buffer [4096];
  
  iVar2 = duckdb::ArenaAllocator::SizeInBytes();
  total_length = iVar2 + 0x1c;
  (*this->trans->_vptr_TTransport[9])(this->trans,&total_length,4);
  (*this->trans->_vptr_TTransport[9])(this->trans,this->nonce,0xc);
  lVar4 = duckdb::ArenaAllocator::GetTail();
  local_1058 = &this->aes;
  local_1050 = this;
  for (; lVar4 != 0; lVar4 = *(long *)(lVar4 + 0x30)) {
    lVar6 = 0;
    for (uVar8 = 0; uVar8 < *(ulong *)(lVar4 + 0x18); uVar8 = uVar8 + 0x1000) {
      uVar7 = *(ulong *)(lVar4 + 0x18) + lVar6;
      if (0xfff < uVar7) {
        uVar7 = 0x1000;
      }
      pEVar5 = shared_ptr<duckdb::EncryptionState,_true>::operator->(local_1058);
      uVar3 = (**(code **)(*(long *)pEVar5 + 0x20))
                        (pEVar5,*(long *)(lVar4 + 8) + uVar8,uVar7,aes_buffer,0x1000);
      (*local_1050->trans->_vptr_TTransport[9])(local_1050->trans,aes_buffer,(ulong)uVar3);
      lVar6 = lVar6 + -0x1000;
    }
  }
  pEVar5 = shared_ptr<duckdb::EncryptionState,_true>::operator->(local_1058);
  uVar3 = (**(code **)(*(long *)pEVar5 + 0x28))(pEVar5,aes_buffer,0,tag,0x10);
  pEVar1 = local_1050;
  (*local_1050->trans->_vptr_TTransport[9])(local_1050->trans,aes_buffer,(ulong)uVar3);
  (*pEVar1->trans->_vptr_TTransport[9])(pEVar1->trans,tag,0x10);
  return total_length + 4;
}

Assistant:

uint32_t Finalize() {
		// Write length
		const auto ciphertext_length = allocator.SizeInBytes();
		const uint32_t total_length = ParquetCrypto::NONCE_BYTES + ciphertext_length + ParquetCrypto::TAG_BYTES;

		trans.write(const_data_ptr_cast(&total_length), ParquetCrypto::LENGTH_BYTES);
		// Write nonce at beginning of encrypted chunk
		trans.write(nonce, ParquetCrypto::NONCE_BYTES);

		data_t aes_buffer[ParquetCrypto::CRYPTO_BLOCK_SIZE];
		auto current = allocator.GetTail();

		// Loop through the whole chunk
		while (current != nullptr) {
			for (idx_t pos = 0; pos < current->current_position; pos += ParquetCrypto::CRYPTO_BLOCK_SIZE) {
				auto next = MinValue<idx_t>(current->current_position - pos, ParquetCrypto::CRYPTO_BLOCK_SIZE);
				auto write_size =
				    aes->Process(current->data.get() + pos, next, aes_buffer, ParquetCrypto::CRYPTO_BLOCK_SIZE);
				trans.write(aes_buffer, write_size);
			}
			current = current->prev;
		}

		// Finalize the last encrypted data
		data_t tag[ParquetCrypto::TAG_BYTES];
		auto write_size = aes->Finalize(aes_buffer, 0, tag, ParquetCrypto::TAG_BYTES);
		trans.write(aes_buffer, write_size);
		// Write tag for verification
		trans.write(tag, ParquetCrypto::TAG_BYTES);

		return ParquetCrypto::LENGTH_BYTES + total_length;
	}